

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

string * __thiscall
tinyformat::format<int,char_const*>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,int *args,char **args_1)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream aoStack_1e8 [112];
  ios_base local_178 [264];
  FormatArg *local_70;
  undefined4 local_68;
  FormatArg local_60;
  int *local_48;
  code *local_40;
  code *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(aoStack_1e8);
  local_70 = &local_60;
  local_68 = 2;
  local_60.m_formatImpl = detail::FormatArg::formatImpl<int>;
  local_60.m_toIntImpl = detail::FormatArg::toIntImpl<int>;
  local_40 = detail::FormatArg::formatImpl<char_const*>;
  local_38 = detail::FormatArg::toIntImpl<char_const*>;
  local_60.m_value = fmt;
  local_48 = args;
  detail::formatImpl((ostream *)aoStack_1e8,(char *)this,local_70,2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1e8);
  std::ios_base::~ios_base(local_178);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}